

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbdrec_primaldual_tvl1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  double dVar2;
  int iVar3;
  ostream *poVar4;
  LBDOperator *pLVar5;
  char *local_498;
  vector<int,_std::allocator<int>_> local_488;
  _InputArray local_468;
  allocator local_449;
  string local_448 [32];
  _InputArray local_428;
  string local_410 [32];
  _OutputArray local_3f0;
  Mat local_3d8 [8];
  Mat res8;
  stringstream local_378 [8];
  stringstream windowNameStr;
  ostream local_368 [376];
  Size_<int> local_1f0;
  Point_<int> local_1e8;
  Size_<int> local_1e0;
  undefined1 local_1d8 [8];
  Mat result;
  Size_<int> local_178;
  LBDOperator *local_170;
  LBDOperator *LBD;
  Point patchOffset;
  Size patchSize;
  Mat local_140 [8];
  Mat testImagef;
  undefined1 local_d8 [8];
  Mat testImage;
  Size local_c8;
  allocator local_61;
  string local_60 [8];
  string filename;
  int local_40;
  int local_3c;
  int c;
  int optionIndex;
  float operator_norm;
  int interactive;
  int process_only_fast;
  int offset;
  float lambda;
  int iterations;
  int pside;
  int lbdType;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _pside = argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    print_usage(_stdout,argv);
    argv_local._4_4_ = 0;
  }
  else {
    iterations = 0;
    lambda = 4.48416e-44;
    offset = 1000;
    process_only_fast = 0x3dcccccd;
    interactive = 0;
    operator_norm = 0.0;
    optionIndex = 0;
    c = 0x41200000;
    if ((main::long_options == '\0') &&
       (iVar3 = __cxa_guard_acquire(&main::long_options), iVar3 != 0)) {
      main::long_options[0].name = "lbd";
      main::long_options[0].has_arg = 1;
      main::long_options[0].flag = (int *)0x0;
      main::long_options[0].val = 0;
      main::long_options[1].name = "fast";
      main::long_options[1].has_arg = 0;
      main::long_options[1].flag = (int *)&operator_norm;
      main::long_options[1].val = 1;
      main::long_options[2].name = "interactive";
      main::long_options[2].has_arg = 0;
      main::long_options[2].flag = &optionIndex;
      main::long_options[2].val = 1;
      main::long_options[3].name = "norm";
      main::long_options[3].has_arg = 1;
      main::long_options[3].flag = (int *)0x0;
      main::long_options[3].val = 0;
      memset(main::long_options + 4,0,0x20);
      __cxa_guard_release(&main::long_options);
    }
    local_40 = getopt_long((int)argv_local,_pside,"i:l:o:p:",main::long_options,&local_3c);
    while (local_40 != -1) {
      if (local_40 == 0) {
        if (local_3c == 0) {
          iVar3 = strncmp(_optarg,"freak",5);
          if (iVar3 == 0) {
            iterations = 0;
          }
          else {
            iVar3 = strncmp(_optarg,"brief",5);
            if (iVar3 == 0) {
              iterations = 2;
            }
            else {
              iVar3 = strncmp(_optarg,"exfreak",7);
              if (iVar3 == 0) {
                iterations = 3;
              }
              else {
                iterations = 1;
              }
            }
          }
        }
        if (local_3c == 3) {
          dVar2 = atof(_optarg);
          c = (int)(float)dVar2;
        }
      }
      else if (local_40 == 0x3f) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown option: -");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3f);
        std::operator<<(poVar4," (ignored)\n");
      }
      else if (local_40 == 0x69) {
        offset = atoi(_optarg);
      }
      else if (local_40 == 0x6c) {
        dVar2 = atof(_optarg);
        process_only_fast = (int)(float)dVar2;
      }
      else if (local_40 == 0x6f) {
        interactive = atoi(_optarg);
      }
      else if (local_40 == 0x70) {
        iVar3 = atoi(_optarg);
        lambda = (float)(iVar3 % 2 + iVar3);
      }
      local_40 = getopt_long((int)argv_local,_pside,"i:l:o:p:",main::long_options,&local_3c);
    }
    if (optionIndex == 0) {
      local_498 = _pside[(int)argv_local + -2];
    }
    else {
      local_498 = _pside[(int)argv_local + -1];
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,local_498,&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    cv::imread((string *)local_d8,(int)local_60);
    if (local_c8 == (Size)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error opening image: ");
      poVar4 = std::operator<<(poVar4,local_60);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      print_usage(_stderr,_pside);
      argv_local._4_4_ = 1;
    }
    else {
      cv::Mat::Mat(local_140);
      cv::_OutputArray::_OutputArray((_OutputArray *)&patchSize,local_140);
      cv::Mat::convertTo((_OutputArray *)local_d8,(int)&patchSize,0.00392156862745098,0.0);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&patchSize);
      cv::Size_<int>::Size_((Size_<int> *)&patchOffset,(int)lambda,(int)lambda);
      if (interactive == 0) {
        interactive = (int)lambda;
      }
      cv::Point_<int>::Point_((Point_<int> *)&LBD,interactive,interactive);
      pLVar5 = lts2::CreateLbdOperator(iterations,0x200);
      local_170 = pLVar5;
      cv::Size_<int>::Size_(&local_178,(Size_<int> *)&patchOffset);
      (*(pLVar5->super_LinearOperator)._vptr_LinearOperator[5])(pLVar5,&local_178);
      lts2::LinearOperator::setNorm(&local_170->super_LinearOperator,(float)c);
      cv::Mat::Mat((Mat *)local_1d8);
      if (operator_norm == 0.0) {
        cv::Size_<int>::Size_(&local_1e0,(Size_<int> *)&patchOffset);
        cv::Point_<int>::Point_(&local_1e8,(Point_<int> *)&LBD);
        lts2::PerformTVL1OnImage
                  (local_140,&local_1e0,&local_1e8,local_170,(Mat *)local_1d8,offset,
                   (float)process_only_fast,0.5);
      }
      else {
        cv::Size_<int>::Size_(&local_1f0,(Size_<int> *)&patchOffset);
        lts2::PerformTVL1OnImageFAST
                  (local_140,&local_1f0,local_170,(Mat *)local_1d8,offset,(float)process_only_fast,
                   0.5);
      }
      std::__cxx11::stringstream::stringstream(local_378);
      poVar4 = std::operator<<(local_368,"Primal-Dual (TVL1)");
      std::operator<<(poVar4," ");
      if (operator_norm != 0.0) {
        poVar4 = std::operator<<(local_368,"FAST ");
        std::operator<<(poVar4," ");
      }
      switch(iterations) {
      case 0:
        std::operator<<(local_368,"FREAK");
        break;
      case 1:
        std::operator<<(local_368,"Randomized FREAK");
        break;
      case 2:
        std::operator<<(local_368,"BRIEF");
        break;
      case 3:
        std::operator<<(local_368,"Ex-FREAK");
      }
      cv::Mat::Mat(local_3d8);
      cv::_OutputArray::_OutputArray(&local_3f0,local_3d8);
      cv::Mat::convertTo((_OutputArray *)local_1d8,(int)&local_3f0,255.0,0.0);
      cv::_OutputArray::~_OutputArray(&local_3f0);
      if (optionIndex < 1) {
        pcVar1 = _pside[(int)argv_local + -1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_448,pcVar1,&local_449);
        cv::_InputArray::_InputArray(&local_468,local_3d8);
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_488);
        cv::imwrite(local_448,&local_468,(vector *)&local_488);
        std::vector<int,_std::allocator<int>_>::~vector(&local_488);
        cv::_InputArray::~_InputArray(&local_468);
        std::__cxx11::string::~string(local_448);
        std::allocator<char>::~allocator((allocator<char> *)&local_449);
      }
      else {
        std::__cxx11::stringstream::str();
        cv::_InputArray::_InputArray(&local_428,local_3d8);
        cv::imshow(local_410,&local_428);
        cv::_InputArray::~_InputArray(&local_428);
        std::__cxx11::string::~string(local_410);
        cv::waitKey(0);
      }
      argv_local._4_4_ = 0;
      cv::Mat::~Mat(local_3d8);
      std::__cxx11::stringstream::~stringstream(local_378);
      cv::Mat::~Mat((Mat *)local_1d8);
      cv::Mat::~Mat(local_140);
    }
    cv::Mat::~Mat((Mat *)local_d8);
    std::__cxx11::string::~string(local_60);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 2)
  {
    print_usage(stdout, argv);
    return 0;
  }

  int lbdType = 0;
  int pside = 32;
  int iterations = 1000;
  float lambda = 0.1;
  int offset = 0;
  int process_only_fast = 0;
  int interactive = 0;
  float operator_norm = 10.0;

  static struct option long_options[] = {
    {"lbd", required_argument, 0, 0},
    {"fast", no_argument, &process_only_fast, 1},
    {"interactive", no_argument, &interactive, 1},
    {"norm", required_argument, 0, 0},
    {0, 0, 0, 0}
  };

  int optionIndex;
  int c = getopt_long(argc, argv, "i:l:o:p:", long_options, &optionIndex);
  
  while (c != -1)
  {
    switch (c)
    {
    case 0:
      if (optionIndex == 0)
      {
        if (strncmp(optarg, "freak", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeFreak;
        else if (strncmp(optarg, "brief", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
        else if (strncmp(optarg, "exfreak", 7) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeExFreak;
        else lbdType = (int)lbd::LBD_TYPE::eTypeRandomFreak;
      }
      if (optionIndex == 3)
      {
        operator_norm = (float)atof(optarg);
      }
      break;
      
    case 'i':
      iterations = atoi(optarg);
      break;

    case 'l':
      lambda = (float)atof(optarg);
      break;

    case 'p':
      pside = atoi(optarg);
      pside += (pside % 2);   // Enforce even size
      break;

    case 'o':
      offset = atoi(optarg);
      break;

    case '?':
      std::cerr << "Unknown option: -" << c << " (ignored)\n";
      break;

    default:
      break;
    }

    c = getopt_long(argc, argv, "i:l:o:p:", long_options, &optionIndex);
  }

  std::string filename = (interactive == 0 ? argv[argc-2] : argv[argc-1]);
  cv::Mat testImage = cv::imread(filename, 0);
  if (!testImage.data)
  {
    std::cerr << "Error opening image: " << filename << std::endl;
    print_usage(stderr, argv);
    return EXIT_FAILURE;
  }

  cv::Mat testImagef;
  testImage.convertTo(testImagef, CV_32F, 1.0/255.0);

  cv::Size patchSize(pside,pside);
  if (offset == 0) offset = pside;
  cv::Point patchOffset(offset,offset);

  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType);
  LBD->initWithPatchSize(patchSize);
  LBD->setNorm(operator_norm);

  cv::Mat result;

  if (process_only_fast == 0)
    lts2::PerformTVL1OnImage(testImagef, patchSize, patchOffset, *LBD, result, iterations, lambda);
  else
    lts2::PerformTVL1OnImageFAST(testImagef, patchSize, *LBD, result, iterations, lambda);

  std::stringstream windowNameStr;
  windowNameStr << "Primal-Dual (TVL1)" << " ";
  if (process_only_fast != 0)
    windowNameStr << "FAST " << " ";

  switch (lbdType)
  {
  case (int)lbd::LBD_TYPE::eTypeFreak:
    windowNameStr << "FREAK";
    break;

  case (int)lbd::LBD_TYPE::eTypeRandomFreak:
    windowNameStr << "Randomized FREAK";
    break;

  case (int)lbd::LBD_TYPE::eTypeBrief:
    windowNameStr << "BRIEF";
    break;

  case (int)lbd::LBD_TYPE::eTypeExFreak:
    windowNameStr << "Ex-FREAK";
    break;
  }

  cv::Mat res8;
  result.convertTo(res8, CV_8U, 255.0);

  if (interactive > 0)
  {
    cv::imshow(windowNameStr.str(), res8);
    cv::waitKey();
  }
  else cv::imwrite(argv[argc-1], res8);

  return EXIT_SUCCESS;
}